

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_6aa98::DepsLogTestRecompact::Run(DepsLogTestRecompact *this)

{
  Test *pTVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  LoadStatus LVar6;
  uint uVar7;
  Node *pNVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  Deps *pDVar9;
  Node *pNVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  State *this_00;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  StringPiece path_03;
  StringPiece path_04;
  StringPiece path_05;
  StringPiece path_06;
  StringPiece path_07;
  StringPiece path_08;
  StringPiece path_09;
  StringPiece path_10;
  StringPiece path_11;
  StringPiece path_12;
  vector<Node_*,_std::allocator<Node_*>_> deps;
  string err;
  uint local_284;
  DepsLog log;
  stat st;
  State state;
  char kManifest [75];
  
  pcVar12 = "rule cc\n  command = cc\n  deps = gcc\nbuild out.o: cc\nbuild other_out.o: cc\n";
  pcVar13 = kManifest;
  for (lVar11 = 0x4b; lVar11 != 0; lVar11 = lVar11 + -1) {
    *pcVar13 = *pcVar12;
    pcVar12 = pcVar12 + 1;
    pcVar13 = pcVar13 + 1;
  }
  this_00 = &state;
  State::State(this_00);
  iVar5 = g_current_test->assertion_failures_;
  AssertParse(this_00,kManifest,(ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  if (iVar5 == g_current_test->assertion_failures_) {
    log.file_path_._M_dataplus._M_p = (pointer)&log.file_path_.field_2;
    log.needs_recompaction_ = false;
    log.file_ = (FILE *)0x0;
    log.file_path_._M_string_length = 0;
    log.file_path_.field_2._M_local_buf[0] = '\0';
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&st,"DepsLogTest-tempfile",(allocator<char> *)&deps);
    bVar3 = DepsLog::OpenForWrite(&log,(string *)&st,&err);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0xbb,"log.OpenForWrite(kTestFilename, &err)");
    std::__cxx11::string::~string((string *)&st);
    pTVar1 = g_current_test;
    if (bVar3) {
      bVar3 = std::operator==("",&err);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xbc,"\"\" == err");
      if (!bVar3) {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        goto LAB_00153737;
      }
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      path.len_ = 5;
      path.str_ = "foo.h";
      st.st_dev = (__dev_t)State::GetNode(&state,path,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&st);
      path_00.len_ = 5;
      path_00.str_ = "bar.h";
      st.st_dev = (__dev_t)State::GetNode(&state,path_00,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&st);
      path_01.len_ = 5;
      path_01.str_ = "out.o";
      pNVar8 = State::GetNode(&state,path_01,0);
      DepsLog::RecordDeps(&log,pNVar8,1,&deps);
      if (deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      path_02.len_ = 5;
      path_02.str_ = "foo.h";
      st.st_dev = (__dev_t)State::GetNode(&state,path_02,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&st);
      path_03.len_ = 5;
      path_03.str_ = "baz.h";
      st.st_dev = (__dev_t)State::GetNode(&state,path_03,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&st);
      path_04.len_ = 0xb;
      path_04.str_ = "other_out.o";
      pNVar8 = State::GetNode(&state,path_04,0);
      DepsLog::RecordDeps(&log,pNVar8,1,&deps);
      DepsLog::Close(&log);
      pTVar1 = g_current_test;
      iVar5 = stat("DepsLogTest-tempfile",(stat *)&st);
      bVar3 = testing::Test::Check
                        (pTVar1,iVar5 == 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xcb,"0 == stat(kTestFilename, &st)");
      if (bVar3) {
        this_00 = (State *)(ulong)(uint)st.st_size;
        bVar4 = testing::Test::Check
                          (g_current_test,0 < (int)(uint)st.st_size,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                           ,0xcd,"file_size > 0");
        bVar3 = true;
        if (!bVar4) goto LAB_0015370f;
      }
      else {
LAB_0015370f:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        bVar3 = false;
      }
      std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
                (&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00153737:
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&err);
    DepsLog::~DepsLog(&log);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    bVar3 = false;
  }
  State::~State(&state);
  if (!bVar3) {
    return;
  }
  State::State(&state);
  uVar7 = g_current_test->assertion_failures_;
  AssertParse(&state,kManifest,(ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  if (uVar7 == g_current_test->assertion_failures_) {
    log.file_path_._M_dataplus._M_p = (pointer)&log.file_path_.field_2;
    log.needs_recompaction_ = false;
    log.file_ = (FILE *)0x0;
    log.file_path_._M_string_length = 0;
    log.file_path_.field_2._M_local_buf[0] = '\0';
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&st,"DepsLogTest-tempfile",(allocator<char> *)&deps);
    LVar6 = DepsLog::Load(&log,(string *)&st,&state,&err);
    bVar3 = testing::Test::Check
                      (pTVar1,LVar6 != LOAD_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0xd7,"log.Load(kTestFilename, &state, &err)");
    uVar7 = (uint)CONCAT71(extraout_var,bVar3);
    std::__cxx11::string::~string((string *)&st);
    pTVar1 = g_current_test;
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&st,"DepsLogTest-tempfile",(allocator<char> *)&deps);
      bVar3 = DepsLog::OpenForWrite(&log,(string *)&st,&err);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xd9,"log.OpenForWrite(kTestFilename, &err)");
      uVar7 = (uint)CONCAT71(extraout_var_00,bVar3);
      std::__cxx11::string::~string((string *)&st);
      pTVar1 = g_current_test;
      if (!bVar3) goto LAB_001539e3;
      bVar3 = std::operator==("",&err);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xda,"\"\" == err");
      if (!bVar3) {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        goto LAB_001539e6;
      }
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      path_05.len_ = 5;
      path_05.str_ = "foo.h";
      st.st_dev = (__dev_t)State::GetNode(&state,path_05,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&st);
      path_06.len_ = 5;
      path_06.str_ = "out.o";
      pNVar8 = State::GetNode(&state,path_06,0);
      DepsLog::RecordDeps(&log,pNVar8,1,&deps);
      DepsLog::Close(&log);
      pTVar1 = g_current_test;
      iVar5 = stat("DepsLogTest-tempfile",(stat *)&st);
      bVar3 = testing::Test::Check
                        (pTVar1,iVar5 == 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xe2,"0 == stat(kTestFilename, &st)");
      uVar2 = (uint)st.st_size;
      if (bVar3) {
        bVar4 = testing::Test::Check
                          (g_current_test,(int)this_00 < (int)(uint)st.st_size,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                           ,0xe5,"file_size_2 > file_size");
        bVar3 = true;
        uVar7 = uVar2;
        if (!bVar4) goto LAB_001539c7;
      }
      else {
LAB_001539c7:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        bVar3 = false;
      }
      std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
                (&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
    }
    else {
LAB_001539e3:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_001539e6:
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&err);
    DepsLog::~DepsLog(&log);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    bVar3 = false;
  }
  State::~State(&state);
  if (!bVar3) {
    return;
  }
  State::State(&state);
  iVar5 = g_current_test->assertion_failures_;
  AssertParse(&state,kManifest,(ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  if (iVar5 == g_current_test->assertion_failures_) {
    log.file_path_._M_dataplus._M_p = (pointer)&log.file_path_.field_2;
    log.needs_recompaction_ = false;
    log.file_ = (FILE *)0x0;
    log.file_path_._M_string_length = 0;
    log.file_path_.field_2._M_local_buf[0] = '\0';
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&st,"DepsLogTest-tempfile",(allocator<char> *)&deps);
    LVar6 = DepsLog::Load(&log,(string *)&st,&state,&err);
    bVar3 = testing::Test::Check
                      (pTVar1,LVar6 != LOAD_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0xf0,"log.Load(kTestFilename, &state, &err)");
    std::__cxx11::string::~string((string *)&st);
    if (bVar3) {
      path_07.len_ = 5;
      path_07.str_ = "out.o";
      pNVar8 = State::GetNode(&state,path_07,0);
      pDVar9 = DepsLog::GetDeps(&log,pNVar8);
      bVar3 = testing::Test::Check
                        (g_current_test,pDVar9 != (Deps *)0x0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xf4,"deps");
      if ((!bVar3) ||
         (bVar3 = testing::Test::Check
                            (g_current_test,pDVar9->mtime == 1,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                             ,0xf5,"1 == deps->mtime"), !bVar3)) goto LAB_0015406b;
      bVar3 = testing::Test::Check
                        (g_current_test,pDVar9->node_count == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xf6,"1 == deps->node_count");
      pTVar1 = g_current_test;
      if (!bVar3) goto LAB_0015459a;
      bVar3 = std::operator==("foo.h",&(*pDVar9->nodes)->path_);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xf7,"\"foo.h\" == deps->nodes[0]->path()");
      if (!bVar3) goto LAB_00154062;
      path_08.len_ = 0xb;
      path_08.str_ = "other_out.o";
      pNVar10 = State::GetNode(&state,path_08,0);
      pDVar9 = DepsLog::GetDeps(&log,pNVar10);
      bVar3 = testing::Test::Check
                        (g_current_test,pDVar9 != (Deps *)0x0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xfb,"deps");
      if ((!bVar3) ||
         (bVar3 = testing::Test::Check
                            (g_current_test,pDVar9->mtime == 1,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                             ,0xfc,"1 == deps->mtime"), !bVar3)) goto LAB_0015406b;
      bVar3 = testing::Test::Check
                        (g_current_test,pDVar9->node_count == 2,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xfd,"2 == deps->node_count");
      pTVar1 = g_current_test;
      if (!bVar3) {
LAB_001545a9:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        goto LAB_0015406e;
      }
      bVar3 = std::operator==("foo.h",&(*pDVar9->nodes)->path_);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xfe,"\"foo.h\" == deps->nodes[0]->path()");
      pTVar1 = g_current_test;
      if (!bVar3) goto LAB_001545a9;
      bVar3 = std::operator==("baz.h",&pDVar9->nodes[1]->path_);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xff,"\"baz.h\" == deps->nodes[1]->path()");
      pTVar1 = g_current_test;
      if (!bVar3) goto LAB_0015459a;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&st,"DepsLogTest-tempfile",(allocator<char> *)&deps);
      bVar3 = DepsLog::Recompact(&log,(string *)&st,&err);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x101,"log.Recompact(kTestFilename, &err)");
      std::__cxx11::string::~string((string *)&st);
      if (!bVar3) goto LAB_00154062;
      pDVar9 = DepsLog::GetDeps(&log,pNVar8);
      bVar3 = testing::Test::Check
                        (g_current_test,pDVar9 != (Deps *)0x0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x105,"deps");
      if ((!bVar3) ||
         (bVar3 = testing::Test::Check
                            (g_current_test,pDVar9->mtime == 1,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                             ,0x106,"1 == deps->mtime"), !bVar3)) {
LAB_0015406b:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        goto LAB_0015406e;
      }
      bVar3 = testing::Test::Check
                        (g_current_test,pDVar9->node_count == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x107,"1 == deps->node_count");
      pTVar1 = g_current_test;
      if (!bVar3) goto LAB_001545a9;
      bVar3 = std::operator==("foo.h",&(*pDVar9->nodes)->path_);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x108,"\"foo.h\" == deps->nodes[0]->path()");
      if (!bVar3) goto LAB_0015406b;
      bVar3 = testing::Test::Check
                        (g_current_test,
                         pNVar8 == log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start[pNVar8->id_],
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x109,"out == log.nodes()[out->id()]");
      if (!bVar3) goto LAB_00154062;
      pDVar9 = DepsLog::GetDeps(&log,pNVar10);
      bVar3 = testing::Test::Check
                        (g_current_test,pDVar9 != (Deps *)0x0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x10c,"deps");
      if ((!bVar3) ||
         (bVar3 = testing::Test::Check
                            (g_current_test,pDVar9->mtime == 1,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                             ,0x10d,"1 == deps->mtime"), !bVar3)) goto LAB_0015406b;
      bVar3 = testing::Test::Check
                        (g_current_test,pDVar9->node_count == 2,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x10e,"2 == deps->node_count");
      pTVar1 = g_current_test;
      if (!bVar3) {
LAB_0015459a:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        goto LAB_0015406e;
      }
      bVar3 = std::operator==("foo.h",&(*pDVar9->nodes)->path_);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x10f,"\"foo.h\" == deps->nodes[0]->path()");
      pTVar1 = g_current_test;
      if (!bVar3) goto LAB_0015459a;
      bVar3 = std::operator==("baz.h",&pDVar9->nodes[1]->path_);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x110,"\"baz.h\" == deps->nodes[1]->path()");
      if (!bVar3) goto LAB_0015406b;
      bVar3 = testing::Test::Check
                        (g_current_test,
                         pNVar10 ==
                         log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                         super__Vector_impl_data._M_start[pNVar10->id_],
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x111,"other_out == log.nodes()[other_out->id()]");
      pTVar1 = g_current_test;
      if (!bVar3) goto LAB_00154062;
      iVar5 = stat("DepsLogTest-tempfile",(stat *)&st);
      bVar3 = testing::Test::Check
                        (pTVar1,iVar5 == 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x115,"0 == stat(kTestFilename, &st)");
      if (bVar3) {
        local_284 = (uint)st.st_size;
        bVar4 = testing::Test::Check
                          (g_current_test,(int)(uint)st.st_size < (int)uVar7,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                           ,0x117,"file_size_3 < file_size_2");
        bVar3 = true;
        if (!bVar4) goto LAB_0015404e;
      }
      else {
LAB_0015404e:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        bVar3 = false;
      }
    }
    else {
LAB_00154062:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0015406e:
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&err);
    DepsLog::~DepsLog(&log);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    bVar3 = false;
  }
  State::~State(&state);
  if (!bVar3) {
    return;
  }
  State::State(&state);
  pTVar1 = g_current_test;
  log.file_path_._M_dataplus._M_p = (pointer)&log.file_path_.field_2;
  log.needs_recompaction_ = false;
  log.file_ = (FILE *)0x0;
  log.file_path_._M_string_length = 0;
  log.file_path_.field_2._M_local_buf[0] = '\0';
  log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&st,"DepsLogTest-tempfile",(allocator<char> *)&deps);
  LVar6 = DepsLog::Load(&log,(string *)&st,&state,&err);
  bVar3 = testing::Test::Check
                    (pTVar1,LVar6 != LOAD_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x121,"log.Load(kTestFilename, &state, &err)");
  std::__cxx11::string::~string((string *)&st);
  if (!bVar3) goto LAB_0015454f;
  path_09.len_ = 5;
  path_09.str_ = "out.o";
  pNVar8 = State::GetNode(&state,path_09,0);
  pDVar9 = DepsLog::GetDeps(&log,pNVar8);
  bVar3 = testing::Test::Check
                    (g_current_test,pDVar9 != (Deps *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x125,"deps");
  if ((!bVar3) ||
     (bVar3 = testing::Test::Check
                        (g_current_test,pDVar9->mtime == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x126,"1 == deps->mtime"), !bVar3)) {
LAB_00154558:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_0015455b;
  }
  bVar3 = testing::Test::Check
                    (g_current_test,pDVar9->node_count == 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x127,"1 == deps->node_count");
  pTVar1 = g_current_test;
  if (!bVar3) {
LAB_001545a3:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_0015455b;
  }
  bVar3 = std::operator==("foo.h",&(*pDVar9->nodes)->path_);
  bVar3 = testing::Test::Check
                    (pTVar1,bVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x128,"\"foo.h\" == deps->nodes[0]->path()");
  if (!bVar3) goto LAB_0015454f;
  path_10.len_ = 0xb;
  path_10.str_ = "other_out.o";
  pNVar10 = State::GetNode(&state,path_10,0);
  pDVar9 = DepsLog::GetDeps(&log,pNVar10);
  bVar3 = testing::Test::Check
                    (g_current_test,pDVar9 != (Deps *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,300,"deps");
  if ((!bVar3) ||
     (bVar3 = testing::Test::Check
                        (g_current_test,pDVar9->mtime == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x12d,"1 == deps->mtime"), !bVar3)) goto LAB_00154558;
  bVar3 = testing::Test::Check
                    (g_current_test,pDVar9->node_count == 2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x12e,"2 == deps->node_count");
  pTVar1 = g_current_test;
  if (bVar3) {
    bVar3 = std::operator==("foo.h",&(*pDVar9->nodes)->path_);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x12f,"\"foo.h\" == deps->nodes[0]->path()");
    pTVar1 = g_current_test;
    if (bVar3) {
      bVar3 = std::operator==("baz.h",&pDVar9->nodes[1]->path_);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x130,"\"baz.h\" == deps->nodes[1]->path()");
      pTVar1 = g_current_test;
      if (!bVar3) goto LAB_001545a3;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&st,"DepsLogTest-tempfile",(allocator<char> *)&deps);
      bVar3 = DepsLog::Recompact(&log,(string *)&st,&err);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x132,"log.Recompact(kTestFilename, &err)");
      std::__cxx11::string::~string((string *)&st);
      if (bVar3) {
        pDVar9 = DepsLog::GetDeps(&log,pNVar8);
        bVar3 = testing::Test::Check
                          (g_current_test,pDVar9 == (Deps *)0x0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                           ,0x136,"deps");
        if (bVar3) {
          pDVar9 = DepsLog::GetDeps(&log,pNVar10);
          bVar3 = testing::Test::Check
                            (g_current_test,pDVar9 == (Deps *)0x0,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                             ,0x139,"deps");
          pTVar1 = g_current_test;
          if (bVar3) {
            path_11.len_ = 5;
            path_11.str_ = "foo.h";
            pNVar8 = State::LookupNode(&state,path_11);
            bVar3 = testing::Test::Check
                              (pTVar1,pNVar8->id_ == -1,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                               ,0x13c,"-1 == state.LookupNode(\"foo.h\")->id()");
            pTVar1 = g_current_test;
            if (bVar3) {
              path_12.len_ = 5;
              path_12.str_ = "baz.h";
              pNVar8 = State::LookupNode(&state,path_12);
              bVar3 = testing::Test::Check
                                (pTVar1,pNVar8->id_ == -1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                 ,0x13d,"-1 == state.LookupNode(\"baz.h\")->id()");
              pTVar1 = g_current_test;
              if (bVar3) {
                iVar5 = stat("DepsLogTest-tempfile",(stat *)&st);
                bVar3 = testing::Test::Check
                                  (pTVar1,iVar5 == 0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                   ,0x141,"0 == stat(kTestFilename, &st)");
                if ((bVar3) &&
                   (bVar3 = testing::Test::Check
                                      (g_current_test,(int)(uint)st.st_size < (int)local_284,
                                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                                       ,0x143,"file_size_4 < file_size_3"), bVar3))
                goto LAB_0015455b;
              }
              goto LAB_0015454f;
            }
          }
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          goto LAB_0015455b;
        }
      }
LAB_0015454f:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      goto LAB_0015455b;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0015455b:
  std::__cxx11::string::~string((string *)&err);
  DepsLog::~DepsLog(&log);
  State::~State(&state);
  return;
}

Assistant:

TEST_F(DepsLogTest, Recompact) {
  const char kManifest[] =
"rule cc\n"
"  command = cc\n"
"  deps = gcc\n"
"build out.o: cc\n"
"build other_out.o: cc\n";

  // Write some deps to the file and grab its size.
  int file_size;
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, kManifest));
    DepsLog log;
    string err;
    ASSERT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);

    deps.clear();
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("baz.h", 0));
    log.RecordDeps(state.GetNode("other_out.o", 0), 1, deps);

    log.Close();

    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    file_size = (int)st.st_size;
    ASSERT_GT(file_size, 0);
  }

  // Now reload the file, and add slightly different deps.
  int file_size_2;
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, kManifest));
    DepsLog log;
    string err;
    ASSERT_TRUE(log.Load(kTestFilename, &state, &err));

    ASSERT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);
    log.Close();

    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    file_size_2 = (int)st.st_size;
    // The file should grow to record the new deps.
    ASSERT_GT(file_size_2, file_size);
  }

  // Now reload the file, verify the new deps have replaced the old, then
  // recompact.
  int file_size_3;
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, kManifest));
    DepsLog log;
    string err;
    ASSERT_TRUE(log.Load(kTestFilename, &state, &err));

    Node* out = state.GetNode("out.o", 0);
    DepsLog::Deps* deps = log.GetDeps(out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(1, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());

    Node* other_out = state.GetNode("other_out.o", 0);
    deps = log.GetDeps(other_out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(2, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());
    ASSERT_EQ("baz.h", deps->nodes[1]->path());

    ASSERT_TRUE(log.Recompact(kTestFilename, &err));

    // The in-memory deps graph should still be valid after recompaction.
    deps = log.GetDeps(out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(1, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());
    ASSERT_EQ(out, log.nodes()[out->id()]);

    deps = log.GetDeps(other_out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(2, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());
    ASSERT_EQ("baz.h", deps->nodes[1]->path());
    ASSERT_EQ(other_out, log.nodes()[other_out->id()]);

    // The file should have shrunk a bit for the smaller deps.
    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    file_size_3 = (int)st.st_size;
    ASSERT_LT(file_size_3, file_size_2);
  }

  // Now reload the file and recompact with an empty manifest. The previous
  // entries should be removed.
  {
    State state;
    // Intentionally not parsing kManifest here.
    DepsLog log;
    string err;
    ASSERT_TRUE(log.Load(kTestFilename, &state, &err));

    Node* out = state.GetNode("out.o", 0);
    DepsLog::Deps* deps = log.GetDeps(out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(1, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());

    Node* other_out = state.GetNode("other_out.o", 0);
    deps = log.GetDeps(other_out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(2, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());
    ASSERT_EQ("baz.h", deps->nodes[1]->path());

    ASSERT_TRUE(log.Recompact(kTestFilename, &err));

    // The previous entries should have been removed.
    deps = log.GetDeps(out);
    ASSERT_FALSE(deps);

    deps = log.GetDeps(other_out);
    ASSERT_FALSE(deps);

    // The .h files pulled in via deps should no longer have ids either.
    ASSERT_EQ(-1, state.LookupNode("foo.h")->id());
    ASSERT_EQ(-1, state.LookupNode("baz.h")->id());

    // The file should have shrunk more.
    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    int file_size_4 = (int)st.st_size;
    ASSERT_LT(file_size_4, file_size_3);
  }
}